

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x2x.cc
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_1a9d::DataTransform<float,_signed_char>::Run
          (DataTransform<float,_signed_char> *this,istream *input_stream)

{
  ulong uVar1;
  istream *in_RSI;
  long in_RDI;
  bool bVar2;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  ostringstream error_message;
  bool is_clipped;
  char output_data;
  invalid_argument *anon_var_0;
  string word;
  float input_data;
  int index;
  char buffer [128];
  ostream *in_stack_fffffffffffffd38;
  allocator *in_stack_fffffffffffffd40;
  ostringstream *in_stack_fffffffffffffd48;
  ostream *in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd5c;
  char in_stack_fffffffffffffd66;
  allocator local_279;
  string local_278 [32];
  ostringstream local_258 [382];
  bool local_da;
  undefined1 local_d9;
  ostringstream *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  int iVar3;
  uint uVar4;
  undefined4 in_stack_ffffffffffffff34;
  string local_c0 [32];
  float local_a0;
  int local_9c;
  char local_98 [128];
  istream *local_18;
  byte local_1;
  
  local_9c = 0;
  local_18 = in_RSI;
  do {
    if ((*(byte *)(in_RDI + 0x35) & 1) == 0) {
      bVar2 = sptk::ReadStream<float>
                        ((float *)in_stack_fffffffffffffd48,(istream *)in_stack_fffffffffffffd40);
      if (!bVar2) goto LAB_00169cf5;
    }
    else {
      std::__cxx11::string::string(local_c0);
      std::operator>>(local_18,local_c0);
      uVar1 = std::__cxx11::string::empty();
      if ((uVar1 & 1) == 0) {
        std::__cxx11::stold((string *)in_stack_fffffffffffffd40,(size_t *)in_stack_fffffffffffffd38)
        ;
        in_stack_fffffffffffffd5c = SUB104(in_ST0,0);
        local_a0 = (float)in_ST0;
        iVar3 = 0;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        in_ST6 = in_ST7;
      }
      else {
        iVar3 = 2;
      }
      std::__cxx11::string::~string(local_c0);
      if (iVar3 != 0) {
        if (iVar3 != 1) {
LAB_00169cf5:
          if (((*(byte *)(in_RDI + 0x36) & 1) != 0) && (local_9c % *(int *)(in_RDI + 0x28) != 0)) {
            std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
          }
          local_1 = 1;
        }
        goto LAB_00169d31;
      }
      in_stack_fffffffffffffd58 = 0;
      in_stack_ffffffffffffff30 = 0;
    }
    local_d9 = (undefined1)(int)local_a0;
    local_da = false;
    if (*(char *)(in_RDI + 0x37) < *(char *)(in_RDI + 0x38)) {
      if (*(int *)(in_RDI + 0x2c) == 1) {
        if ((long)local_a0 < (long)*(char *)(in_RDI + 0x37)) {
          local_d9 = *(undefined1 *)(in_RDI + 0x37);
          local_da = true;
        }
        else {
          local_da = (long)*(char *)(in_RDI + 0x38) < (long)local_a0;
          if (local_da) {
            local_d9 = *(undefined1 *)(in_RDI + 0x38);
          }
        }
      }
      else if (*(int *)(in_RDI + 0x2c) == 2) {
        if ((ulong)((long)local_a0 | (long)(local_a0 - 9.223372e+18) & (long)local_a0 >> 0x3f) <
            (ulong)(long)*(char *)(in_RDI + 0x37)) {
          local_d9 = *(undefined1 *)(in_RDI + 0x37);
          local_da = true;
        }
        else {
          local_da = (ulong)(long)*(char *)(in_RDI + 0x38) <
                     (ulong)((long)local_a0 |
                            (long)(local_a0 - 9.223372e+18) & (long)local_a0 >> 0x3f);
          if (local_da) {
            local_d9 = *(undefined1 *)(in_RDI + 0x38);
          }
        }
      }
      else if (*(int *)(in_RDI + 0x2c) == 3) {
        in_ST6 = in_ST5;
        in_ST7 = in_ST5;
        if ((float)(short)*(char *)(in_RDI + 0x37) <= local_a0) {
          local_da = (float)(short)*(char *)(in_RDI + 0x38) < local_a0;
          if (local_da) {
            local_d9 = *(undefined1 *)(in_RDI + 0x38);
          }
        }
        else {
          local_d9 = *(undefined1 *)(in_RDI + 0x37);
          local_da = true;
        }
      }
    }
    if (((*(byte *)(in_RDI + 0x34) & 1) != 0) && (local_da == false)) {
      if (local_a0 <= 0.0) {
        local_d9 = (undefined1)(int)(local_a0 + -0.5);
      }
      else {
        local_d9 = (undefined1)(int)(local_a0 + 0.5);
      }
    }
    if ((local_da != false) && (*(int *)(in_RDI + 0x30) != 0)) {
      in_stack_fffffffffffffd48 = local_258;
      std::__cxx11::ostringstream::ostringstream(in_stack_fffffffffffffd48);
      in_stack_fffffffffffffd50 =
           (ostream *)std::ostream::operator<<(in_stack_fffffffffffffd48,local_9c);
      std::operator<<(in_stack_fffffffffffffd50,"th data is over the range of output type");
      in_stack_fffffffffffffd40 = &local_279;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_278,"x2x",in_stack_fffffffffffffd40);
      sptk::PrintErrorMessage
                ((string *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                 in_stack_ffffffffffffff28);
      std::__cxx11::string::~string(local_278);
      std::allocator<char>::~allocator((allocator<char> *)&local_279);
      bVar2 = *(int *)(in_RDI + 0x30) == 2;
      if (bVar2) {
        local_1 = 0;
      }
      uVar4 = (uint)bVar2;
      std::__cxx11::ostringstream::~ostringstream(local_258);
      if (uVar4 != 0) goto LAB_00169d31;
      in_stack_ffffffffffffff30 = 0;
    }
    if ((*(byte *)(in_RDI + 0x36) & 1) == 0) {
      bVar2 = sptk::WriteStream<signed_char>
                        ((char)((ulong)in_stack_fffffffffffffd40 >> 0x30),in_stack_fffffffffffffd38)
      ;
      if (!bVar2) {
        local_1 = 0;
LAB_00169d31:
        return (bool)(local_1 & 1);
      }
    }
    else {
      bVar2 = sptk::SnPrintf<signed_char>
                        (in_stack_fffffffffffffd66,
                         (string *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                         (size_t)in_stack_fffffffffffffd50,(char *)in_stack_fffffffffffffd48);
      if (!bVar2) {
        local_1 = 0;
        goto LAB_00169d31;
      }
      std::operator<<((ostream *)&std::cout,local_98);
      if ((local_9c + 1) % *(int *)(in_RDI + 0x28) == 0) {
        std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      }
      else {
        std::operator<<((ostream *)&std::cout,"\t");
      }
    }
    local_9c = local_9c + 1;
  } while( true );
}

Assistant:

bool Run(std::istream* input_stream) const override {
    char buffer[kBufferSize];
    int index(0);
    for (;; ++index) {
      // Read.
      T1 input_data;
      if (is_ascii_input_) {
        std::string word;
        *input_stream >> word;
        if (word.empty()) break;
        try {
          input_data = static_cast<T1>(std::stold(word));
        } catch (std::invalid_argument&) {
          return false;
        }
      } else {
        if (!sptk::ReadStream(&input_data, input_stream)) {
          break;
        }
      }

      // Convert.
      T2 output_data(static_cast<T2>(input_data));

      bool is_clipped(false);
      {
        // Clipping.
        if (minimum_value_ < maximum_value_) {
          if (kSignedInteger == input_numeric_type_) {
            if (static_cast<std::int64_t>(input_data) <
                static_cast<std::int64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::int64_t>(maximum_value_) <
                       static_cast<std::int64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kUnsignedInteger == input_numeric_type_) {
            if (static_cast<std::uint64_t>(input_data) <
                static_cast<std::uint64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::uint64_t>(maximum_value_) <
                       static_cast<std::uint64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kFloatingPoint == input_numeric_type_) {
            if (static_cast<long double>(input_data) <
                static_cast<long double>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<long double>(maximum_value_) <
                       static_cast<long double>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          }
        }

        // Rounding.
        if (rounding_ && !is_clipped) {
          if (0.0 < input_data) {
            output_data = static_cast<T2>(input_data + 0.5);
          } else {
            output_data = static_cast<T2>(input_data - 0.5);
          }
        }
      }

      if (is_clipped && kIgnore != warning_type_) {
        std::ostringstream error_message;
        error_message << index << "th data is over the range of output type";
        sptk::PrintErrorMessage("x2x", error_message);
        if (kExit == warning_type_) return false;
      }

      // Write output.
      if (is_ascii_output_) {
        if (!sptk::SnPrintf(output_data, print_format_, sizeof(buffer),
                            buffer)) {
          return false;
        }
        std::cout << buffer;
        if (0 == (index + 1) % num_column_) {
          std::cout << std::endl;
        } else {
          std::cout << "\t";
        }
      } else {
        if (!sptk::WriteStream(output_data, &std::cout)) {
          return false;
        }
      }
    }

    if (is_ascii_output_ && 0 != index % num_column_) {
      std::cout << std::endl;
    }

    return true;
  }